

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamStandardIndex::SummarizeIndexFile(BamStandardIndex *this)

{
  pointer pBVar1;
  pointer pBVar2;
  int numReferences;
  int local_3c;
  value_type local_38;
  
  ReadNumReferences(this,&local_3c);
  pBVar2 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  local_38.NumBins = 0;
  local_38.NumLinearOffsets = 0;
  local_38.FirstBinFilePosition = 0;
  local_38.FirstLinearOffsetFilePosition = 0;
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::_M_fill_assign(&this->m_indexFileSummary,(long)local_3c,&local_38);
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar2 = (this->m_indexFileSummary).
                super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar2 != pBVar1; pBVar2 = pBVar2 + 1) {
    SummarizeBins(this,pBVar2);
    SummarizeLinearOffsets(this,pBVar2);
  }
  return;
}

Assistant:

void BamStandardIndex::SummarizeIndexFile(void) {

    // load number of reference sequences
    int numReferences;
    ReadNumReferences(numReferences);

    // initialize file summary data
    ReserveForSummary(numReferences);

    // iterate over reference entries
    BaiFileSummary::iterator summaryIter = m_indexFileSummary.begin();
    BaiFileSummary::iterator summaryEnd  = m_indexFileSummary.end();
    for ( int i = 0; summaryIter != summaryEnd; ++summaryIter, ++i )
        SummarizeReference(*summaryIter);
}